

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::MultiThreadRenderCase::executeForContexts
          (MultiThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  Functions *gl;
  SharedPtr<deqp::egl::(anonymous_namespace)::Program> *this_00;
  ostringstream *poVar1;
  pointer ppVar2;
  pointer ppVar3;
  TextureFormat log;
  pointer pDVar4;
  EGLContext pvVar5;
  pointer pvVar6;
  bool bVar7;
  EGLint EVar8;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  Library *egl;
  pointer pDVar12;
  Semaphore *this_01;
  ulong uVar13;
  Program *pPVar14;
  RenderTestThread *ptr;
  long lVar15;
  allocator_type *__a;
  Vec4 *color;
  int iVar16;
  int iVar17;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *this_02;
  long lVar18;
  size_t __n;
  undefined8 in_R9;
  int iVar19;
  ulong uVar20;
  iterator drawOp;
  size_type __n_00;
  pointer drawOp_00;
  int iVar21;
  int iVar22;
  pointer this_03;
  float depth;
  PixelFormat PVar23;
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> semaphores;
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  threads;
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  packets;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  local_230;
  Surface frame;
  Surface refFrame;
  PixelFormat pixelFmt;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Random rnd;
  undefined1 local_1b0 [384];
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar8 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  ppVar2 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  PVar23 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  pixelFmt = PVar23;
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar9 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  log = (TextureFormat)
        ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&refFrame,EVar8,height);
  tcu::Surface::Surface(&frame,EVar8,height);
  dVar10 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase
                        .super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar20 = (ulong)((long)ppVar2 - (long)ppVar3) >> 4;
  iVar19 = (int)uVar20;
  dVar11 = ::deInt32Hash(iVar19);
  deRandom_init(&rnd.m_rnd,dVar10 ^ dVar11);
  __n_00 = (size_type)iVar19;
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&programs,__n_00,__a);
  __n = (size_t)(int)(iVar19 * 2 | 1);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::vector
            (&semaphores,__n,(allocator_type *)local_1b0);
  if (-1 < iVar19 * 4) {
    this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *)(long)(iVar19 * 4);
    pDVar12 = std::
              _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ::_M_allocate(this_02,__n);
    local_230.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar12 + (long)this_02;
    lVar15 = 0;
    for (lVar18 = -(long)this_02;
        local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&pDVar12->type + lVar15),
        lVar18 != 0; lVar18 = lVar18 + 1) {
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->blend = BLENDMODE_NONE;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->depth = DEPTHMODE_NONE;
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->stencil = STENCILMODE_NONE;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->stencilRef = 0;
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->type = PRIMITIVETYPE_TRIANGLE;
      (local_230.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ._M_impl.super__Vector_impl_data._M_finish)->count = 0;
      ((local_230.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
        ._M_impl.super__Vector_impl_data._M_finish)->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      lVar15 = lVar15 + 0x48;
    }
    local_230.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar12;
    std::
    vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
    ::vector(&packets,__n_00,(allocator_type *)local_1b0);
    std::
    vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
    ::vector(&threads,__n_00,(allocator_type *)local_1b0);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_RED_SIZE = ");
    std::ostream::operator<<(poVar1,PVar23.redBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_GREEN_SIZE = ");
    std::ostream::operator<<(poVar1,PVar23.greenBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_BLUE_SIZE = ");
    std::ostream::operator<<(poVar1,PVar23.blueBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_ALPHA_SIZE = ");
    std::ostream::operator<<(poVar1,PVar23.alphaBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_DEPTH_SIZE = ");
    std::ostream::operator<<(poVar1,depthBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_STENCIL_SIZE = ");
    std::ostream::operator<<(poVar1,stencilBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"EGL_SAMPLES = ");
    std::ostream::operator<<(poVar1,EVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    for (this_03 = semaphores.
                   super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_03 !=
        semaphores.
        super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_03 = this_03 + 1) {
      this_01 = (Semaphore *)operator_new(8);
      de::Semaphore::Semaphore(this_01,0,0);
      de::SharedPtr<de::Semaphore>::SharedPtr((SharedPtr<de::Semaphore> *)local_1b0,this_01);
      de::SharedPtr<de::Semaphore>::operator=(this_03,(SharedPtr<de::Semaphore> *)local_1b0);
      de::SharedPtr<de::Semaphore>::release((SharedPtr<de::Semaphore> *)local_1b0);
    }
    drawOp_00 = pDVar12;
    for (; lVar15 != 0; lVar15 = lVar15 + -0x48) {
      anon_unknown_4::randomizeDrawOp(&rnd,drawOp_00);
      drawOp_00 = drawOp_00 + 1;
    }
    iVar22 = 0;
    uVar13 = 0;
    if (0 < iVar19) {
      uVar13 = uVar20 & 0xffffffff;
    }
    iVar17 = 1;
    for (uVar20 = 0; uVar20 != uVar13; uVar20 = uVar20 + 1) {
      std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::resize
                (packets.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar20,2);
      iVar16 = iVar17;
      iVar21 = iVar22;
      for (lVar15 = 0x20; lVar15 != 0x80; lVar15 = lVar15 + 0x30) {
        pDVar4 = packets.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20].
                 super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        de::SharedPtr<de::Semaphore>::operator=
                  ((SharedPtr<de::Semaphore> *)((long)pDVar4 + lVar15 + -0x10),
                   semaphores.
                   super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (iVar16 + -1));
        de::SharedPtr<de::Semaphore>::operator=
                  ((SharedPtr<de::Semaphore> *)((long)&pDVar4->drawOps + lVar15),
                   semaphores.
                   super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar16);
        *(undefined4 *)((long)pDVar4 + lVar15 + -0x18) = 2;
        *(pointer *)((long)pDVar4 + lVar15 + -0x20) = pDVar12 + iVar21;
        iVar21 = iVar21 + iVar19 * 2;
        iVar16 = iVar16 + iVar19;
      }
      iVar22 = iVar22 + 2;
      iVar17 = iVar17 + 1;
    }
    gl = &this->m_gl;
    for (lVar15 = 0;
        ppVar2 = (contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start, uVar13 << 4 != lVar15;
        lVar15 = lVar15 + 0x10) {
      EVar8 = *(EGLint *)((long)&ppVar2->first + lVar15);
      (*egl->_vptr_Library[0x27])
                (egl,display,surface,surface,*(undefined8 *)((long)&ppVar2->second + lVar15));
      dVar10 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar10,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3c6);
      pPVar14 = anon_unknown_4::createProgram(gl,EVar8);
      de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::SharedPtr
                ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_1b0,pPVar14);
      this_00 = (SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)
                ((long)&(programs.
                         super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15);
      de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator=
                (this_00,(SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_1b0);
      de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::~SharedPtr
                ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_1b0);
      (*this_00->m_ptr->_vptr_Program[2])();
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar10 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar10,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3cc);
    }
    EVar8 = ppVar2->first;
    (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
    dVar10 = (*egl->_vptr_Library[0x1f])(egl);
    iVar19 = 0x3d4;
    eglu::checkError(dVar10,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3d4);
    anon_unknown_4::clear(gl,EVar8,color,depth,iVar19);
    anon_unknown_4::finish(gl,EVar8);
    (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
    dVar10 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar10,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3da);
    lVar15 = 0;
    for (lVar18 = 0; uVar13 * 0x18 != lVar18; lVar18 = lVar18 + 0x18) {
      ptr = (RenderTestThread *)operator_new(0x58);
      pvVar6 = packets.
               super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = *(EGLContext *)((long)&ppVar2->second + lVar15);
      EVar8 = *(EGLint *)((long)&ppVar2->first + lVar15);
      pPVar14 = *(Program **)
                 ((long)&(programs.
                          super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15);
      de::Thread::Thread((Thread *)ptr);
      (ptr->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_01e08120;
      ptr->m_egl = egl;
      ptr->m_display = display;
      ptr->m_surface = surface;
      ptr->m_context = pvVar5;
      ptr->m_api = EVar8;
      ptr->m_gl = gl;
      ptr->m_program = pPVar14;
      ptr->m_packets =
           (vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_> *)
           ((long)&(pvVar6->
                   super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar18);
      de::SharedPtr<deqp::egl::RenderTestThread>::SharedPtr
                ((SharedPtr<deqp::egl::RenderTestThread> *)local_1b0,ptr);
      de::SharedPtr<deqp::egl::RenderTestThread>::operator=
                ((SharedPtr<deqp::egl::RenderTestThread> *)
                 ((long)&(threads.
                          super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15),
                 (SharedPtr<deqp::egl::RenderTestThread> *)local_1b0);
      de::SharedPtr<deqp::egl::RenderTestThread>::release
                ((SharedPtr<deqp::egl::RenderTestThread> *)local_1b0);
      de::Thread::start(*(Thread **)
                         ((long)&(threads.
                                  super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15));
      lVar15 = lVar15 + 0x10;
    }
    de::Semaphore::increment
              ((semaphores.
                super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_ptr);
    de::Semaphore::decrement
              (semaphores.
               super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
    ppVar2 = (contexts->
             super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    EVar8 = ppVar2->first;
    (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
    dVar10 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar10,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3ed);
    anon_unknown_4::readPixels(gl,EVar8,&frame);
    (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
    dVar10 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar10,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3f2);
    for (lVar15 = 0; iVar19 = (int)in_R9, uVar13 << 4 != lVar15; lVar15 = lVar15 + 0x10) {
      de::Thread::join(*(Thread **)
                        ((long)&(threads.
                                 super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15));
    }
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&refFrame);
    anon_unknown_4::renderReference
              ((PixelBufferAccess *)local_1b0,&local_230,&pixelFmt,depthBits,stencilBits,iVar19);
    bVar7 = tcu::fuzzyCompare((TestLog *)log,"ComparisonResult","Image comparison result",&refFrame,
                              &frame,0.02,COMPARE_LOG_RESULT);
    if (!bVar7) {
      tcu::TestContext::setTestResult
                ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
    std::
    vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
    ::~vector(&threads);
    std::
    vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
    ::~vector(&packets);
    std::
    vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ::~vector(&local_230);
    std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::
    ~vector(&semaphores);
    std::
    vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
    ::~vector(&programs);
    tcu::Surface::~Surface(&frame);
    tcu::Surface::~Surface(&refFrame);
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void MultiThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl					= m_eglTestCtx.getLibrary();
	const int				width				= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height				= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts			= (int)contexts.size();
	const int				opsPerPacket		= 2;
	const int				packetsPerThread	= 2;
	const int				numThreads			= numContexts;
	const int				numPackets			= numThreads * packetsPerThread;
	const float				threshold			= 0.02f;

	const tcu::PixelFormat	pixelFmt			= getPixelFormat(egl, display, config.config);
	const int				depthBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples			= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log					= m_testCtx.getLog();

	tcu::Surface			refFrame			(width, height);
	tcu::Surface			frame				(width, height);

	de::Random				rnd					(deStringHash(getName()) ^ deInt32Hash(numContexts));

	// Resources that need cleanup
	vector<ProgramSp>				programs	(numContexts);
	vector<SemaphoreSp>				semaphores	(numPackets+1);
	vector<DrawPrimitiveOp>			drawOps		(numPackets*opsPerPacket);
	vector<vector<DrawOpPacket> >	packets		(numThreads);
	vector<RenderTestThreadSp>		threads		(numThreads);

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Initialize semaphores.
	for (vector<SemaphoreSp>::iterator sem = semaphores.begin(); sem != semaphores.end(); ++sem)
		*sem = SemaphoreSp(new de::Semaphore(0));

	// Create draw ops.
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create packets.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		packets[threadNdx].resize(packetsPerThread);

		for (int packetNdx = 0; packetNdx < packetsPerThread; packetNdx++)
		{
			DrawOpPacket& packet = packets[threadNdx][packetNdx];

			// Threads take turns with packets.
			packet.wait		= semaphores[packetNdx*numThreads + threadNdx];
			packet.signal	= semaphores[packetNdx*numThreads + threadNdx + 1];
			packet.numOps	= opsPerPacket;
			packet.drawOps	= &drawOps[(packetNdx*numThreads + threadNdx)*opsPerPacket];
		}
	}

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Create and launch threads (actual rendering starts once first semaphore is signaled).
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		threads[threadNdx] = RenderTestThreadSp(new RenderTestThread(egl, display, surface, contexts[threadNdx].second, contexts[threadNdx].first, m_gl, *programs[threadNdx], packets[threadNdx]));
		threads[threadNdx]->start();
	}

	// Signal start and wait until complete.
	semaphores.front()->increment();
	semaphores.back()->decrement();

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Join threads.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
		threads[threadNdx]->join();

	// Render reference.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}